

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunmatrix_sparse.c
# Opt level: O2

int Test_SUNSparseMatrixToCSR(SUNMatrix A)

{
  int iVar1;
  SUNMatrix *pp_Var2;
  uint uVar3;
  char *__s;
  SUNMatrix csr;
  SUNMatrix csc;
  
  iVar1 = SUNSparseMatrix_ToCSR(A,&csr);
  if (iVar1 == 0) {
    pp_Var2 = &csc;
    iVar1 = SUNSparseMatrix_ToCSC(csr,pp_Var2);
    if (iVar1 == 0) {
      iVar1 = check_matrix(A,csc,4.440892098500626e-14);
      if (iVar1 == 0) {
        puts("    PASSED test -- SUNSparseMatrixToCSR");
        SUNMatDestroy(csr);
      }
      else {
        puts(">>> FAILED test --  Test_SUNSparseMatrixToCSR check_matrix failed");
        SUNMatDestroy(csr);
      }
      uVar3 = (uint)(iVar1 != 0);
      goto LAB_00103d50;
    }
    __s = ">>> FAILED test -- SUNSparseMatrix_ToCSC returned nonzero";
  }
  else {
    __s = ">>> FAILED test -- SUNSparseMatrix_ToCSR returned nonzero";
  }
  puts(__s);
  uVar3 = 1;
  pp_Var2 = &csr;
LAB_00103d50:
  SUNMatDestroy(*pp_Var2);
  return uVar3;
}

Assistant:

int Test_SUNSparseMatrixToCSR(SUNMatrix A)
{
  int failure;
  SUNMatrix csc, csr;
  sunrealtype tol = 200 * SUN_UNIT_ROUNDOFF;

  failure = SUNSparseMatrix_ToCSR(A, &csr);

  if (failure)
  {
    printf(">>> FAILED test -- SUNSparseMatrix_ToCSR returned nonzero\n");
    SUNMatDestroy(csr);
    return (1);
  }

  /* check entries */
  if (SUNSparseMatrix_ToCSC(csr, &csc))
  {
    printf(">>> FAILED test -- SUNSparseMatrix_ToCSC returned nonzero\n");
    SUNMatDestroy(csr);
    return (1);
  }

  if (check_matrix(A, csc, tol))
  {
    printf(
      ">>> FAILED test --  Test_SUNSparseMatrixToCSR check_matrix failed\n");
    SUNMatDestroy(csr);
    SUNMatDestroy(csc);
    return (1);
  }

  printf("    PASSED test -- SUNSparseMatrixToCSR\n");

  SUNMatDestroy(csr);
  SUNMatDestroy(csc);

  return (0);
}